

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseOutgoing.cpp
# Opt level: O0

Result __thiscall
tonk::SessionOutgoing::OnAcknowledgements
          (SessionOutgoing *this,uint8_t *data,uint bytes,Counter64 *ackNonce,uint64_t receiveUsec)

{
  long lVar1;
  uint uVar2;
  char *pcVar3;
  string *desc;
  uint in_ECX;
  byte *in_RDX;
  long *in_RSI;
  ErrorResult *in_RDI;
  long *in_R8;
  long in_R9;
  uint8_t ackack [4];
  BandwidthShape shape;
  int ackResult;
  Counter64 recovered;
  Counter24 partialNonce;
  unsigned_long d_1;
  unsigned_long d;
  SignedType gapSigned;
  ValueType_conflict gapMSB;
  ValueType gap;
  ValueType smallRecent;
  SignedType smallerSigned;
  ValueType_conflict smallerMSB;
  LogStringBuffer buffer;
  char *in_stack_fffffffffffffa78;
  LogStringBuffer *in_stack_fffffffffffffa80;
  uint8_t *in_stack_fffffffffffffa88;
  ErrorType EVar5;
  ErrorResult *pEVar4;
  BandwidthShape *in_stack_fffffffffffffa90;
  SiameseEncoder in_stack_fffffffffffffa98;
  allocator *paVar6;
  ErrorResult *in_stack_fffffffffffffaa0;
  LogStringBuffer *in_stack_fffffffffffffab8;
  OutputWorker *in_stack_fffffffffffffac0;
  undefined4 local_4bc;
  BandwidthShape local_4b8;
  BandwidthShape local_4b0;
  Counter<unsigned_long,_64U> local_4a8;
  allocator local_499;
  string local_498 [32];
  SiameseResult local_478;
  allocator local_471;
  string local_470 [32];
  Counter<unsigned_long,_64U> local_450;
  Counter<unsigned_int,_24U> local_444;
  Counter<unsigned_long,_64U> local_440;
  Counter<unsigned_long,_64U> local_438;
  Counter<unsigned_int,_24U> local_42c;
  Counter<unsigned_long,_64U> local_428;
  Counter<unsigned_long,_64U> local_420;
  Counter<unsigned_long,_64U> local_418 [3];
  allocator local_3f9;
  string local_3f8 [32];
  long local_3d8;
  uint local_3c4;
  byte *local_3c0;
  undefined8 local_398;
  undefined4 local_38c;
  string *local_388;
  char *local_380;
  undefined8 local_360;
  undefined4 local_354;
  string *local_350;
  char *local_348;
  long local_328;
  undefined4 local_31c;
  string *local_318;
  char *local_310;
  ulong local_300;
  Counter<unsigned_long,_64U> *local_2f8;
  Counter<unsigned_long,_64U> *local_2f0;
  ulong local_2e8;
  Counter<unsigned_long,_64U> *local_2e0;
  char *local_2d0;
  long local_2c8;
  Counter<unsigned_long,_64U> *local_2c0;
  Counter<unsigned_long,_64U> *local_2b0;
  byte *local_2a8;
  long local_2a0;
  ulong local_298;
  uint local_290;
  uint local_28c;
  long local_288;
  ulong local_280;
  Counter<unsigned_int,_24U> *local_278;
  Counter<unsigned_long,_64U> *local_270;
  Counter<unsigned_long,_64U> *local_268;
  undefined4 local_254;
  undefined4 *local_250;
  char *local_248;
  undefined4 local_23c;
  long local_238;
  undefined4 local_22c;
  long local_228;
  undefined1 local_210 [16];
  ostream aoStack_200 [376];
  char *local_88;
  undefined4 local_7c;
  long local_78;
  char *local_70;
  string *local_68;
  undefined1 *local_60;
  long local_58;
  string *local_50;
  undefined1 *local_48;
  long local_40;
  string *local_38;
  undefined1 *local_30;
  char *local_28;
  undefined1 *local_20;
  long local_18;
  char *local_10;
  undefined1 *local_8;
  
  if (in_ECX < 6) {
    std::allocator<char>::allocator();
    EVar5 = (ErrorType)((ulong)in_stack_fffffffffffffa88 >> 0x20);
    std::__cxx11::string::string(local_3f8,"Truncated Ack",&local_3f9);
    local_380 = "SessionOutgoing::OnAcknowledgements";
    local_388 = local_3f8;
    local_38c = 0;
    local_398 = 9;
    pcVar3 = (char *)operator_new(0x38);
    ErrorResult::ErrorResult
              (in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98,
               (string *)in_stack_fffffffffffffa90,EVar5,(ErrorCodeT)in_stack_fffffffffffffa80);
    in_RDI->Source = pcVar3;
    std::__cxx11::string::~string(local_3f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
  }
  else {
    local_3d8 = in_R9;
    local_3c4 = in_ECX;
    local_3c0 = in_RDX;
    Counter<unsigned_long,_64U>::Counter(local_418,(ThisType *)(in_RSI + 0x5d));
    local_2e0 = local_418;
    local_2e8 = *in_R8 - local_418[0].Value;
    if (local_2e8 < 0x8000000000000000) {
      Counter<unsigned_long,_64U>::Counter(&local_428,1);
      local_2b0 = &local_420;
      local_2c0 = &local_428;
      Counter<unsigned_long,_64U>::Counter(&local_420,*in_R8 + local_428.Value);
      Counter<unsigned_long,_64U>::operator=
                ((Counter<unsigned_long,_64U> *)(in_RSI + 0x5d),&local_420);
      local_2a8 = local_3c0;
      Counter<unsigned_int,_24U>::Counter
                (&local_42c,(uint)local_3c0[2] << 0x10 | (uint)local_3c0[1] << 8 | (uint)*local_3c0)
      ;
      Counter<unsigned_long,_64U>::Counter(&local_440,(ThisType *)(in_RSI + 0x5f));
      Counter<unsigned_int,_24U>::Counter(&local_444,&local_42c);
      local_268 = &local_438;
      local_270 = &local_440;
      local_278 = &local_444;
      local_280 = (ulong)(local_444.Value & 0x800000);
      local_288 = (ulong)local_444.Value + local_280 * -2;
      local_28c = (uint)local_440.Value & 0xffffff;
      uVar2 = (int)local_288 - local_28c;
      local_290 = uVar2 & 0xffffff;
      local_298 = (ulong)(uVar2 & 0x800000);
      local_2a0 = (ulong)local_290 + local_298 * -2;
      Counter<unsigned_long,_64U>::Counter(&local_438,local_440.Value + local_2a0);
      Counter<unsigned_long,_64U>::Counter(&local_450,(ThisType *)(in_RSI + 0x5f));
      local_2f0 = &local_438;
      local_2f8 = &local_450;
      local_300 = local_438.Value - local_450.Value;
      if (local_300 < 0x8000000000000000) {
        if (6 < local_3c4) {
          local_478 = siamese_encoder_ack(in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
                                          (uint)((ulong)in_stack_fffffffffffffa88 >> 0x20),
                                          (uint *)in_stack_fffffffffffffa80);
          if (local_478 != Siamese_Success) {
            paVar6 = &local_499;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_498,"siamese_encoder_ack failed",paVar6);
            local_328 = (long)(int)local_478;
            local_310 = "SessionOutgoing::OnAcknowledgements";
            local_318 = local_498;
            local_31c = 1;
            pEVar4 = in_RDI;
            desc = (string *)operator_new(0x38);
            ErrorResult::ErrorResult
                      (in_stack_fffffffffffffaa0,(char *)paVar6,desc,
                       (ErrorType)((ulong)pEVar4 >> 0x20),(ErrorCodeT)in_stack_fffffffffffffa80);
            pEVar4->Source = (char *)desc;
            std::__cxx11::string::~string(local_498);
            std::allocator<char>::~allocator((allocator<char> *)&local_499);
            return (Result)in_RDI;
          }
          local_478 = 0;
        }
        Counter<unsigned_long,_64U>::Counter(&local_4a8,&local_438);
        Counter<unsigned_long,_64U>::operator=
                  ((Counter<unsigned_long,_64U> *)(in_RSI + 0x5f),&local_4a8);
        in_RSI[0x5e] = local_3d8;
        BandwidthShape::BandwidthShape(&local_4b0);
        BandwidthShape::Decompress(in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
        local_4b8 = local_4b0;
        SenderBandwidthControl::OnReceiverFeedback((SenderBandwidthControl *)in_RSI[0x44],local_4b0)
        ;
        if ((int)in_RSI[0x60] == (int)in_RSI[0x61]) {
          local_250 = &local_4bc;
          local_254 = (undefined4)in_RSI[0x60];
          local_4bc = local_254;
          (**(code **)(*in_RSI + 0x10))(in_RDI,in_RSI,2,&local_4bc,3);
        }
        else {
          Result::Success();
        }
      }
      else {
        paVar6 = &local_471;
        std::allocator<char>::allocator();
        EVar5 = (ErrorType)((ulong)in_stack_fffffffffffffa88 >> 0x20);
        std::__cxx11::string::string(local_470,"Ack was sent out of order",paVar6);
        local_348 = "SessionOutgoing::OnAcknowledgements";
        local_350 = local_470;
        local_354 = 0;
        local_360 = 9;
        pcVar3 = (char *)operator_new(0x38);
        ErrorResult::ErrorResult
                  (in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98,
                   (string *)in_stack_fffffffffffffa90,EVar5,(ErrorCodeT)in_stack_fffffffffffffa80);
        in_RDI->Source = pcVar3;
        std::__cxx11::string::~string(local_470);
        std::allocator<char>::~allocator((allocator<char> *)&local_471);
      }
    }
    else {
      lVar1 = in_RSI[0x41];
      local_2d0 = "Ignored re-ordered ack";
      local_23c = 1;
      local_248 = "Ignored re-ordered ack";
      local_22c = 1;
      local_2c8 = lVar1;
      local_238 = lVar1;
      local_228 = lVar1;
      if (*(int *)(lVar1 + 8) < 2) {
        local_7c = 1;
        local_88 = "Ignored re-ordered ack";
        local_78 = lVar1;
        logger::LogStringBuffer::LogStringBuffer
                  (in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,Trace);
        local_68 = (string *)(lVar1 + 0x38);
        local_70 = local_88;
        local_60 = local_210;
        local_58 = lVar1;
        local_50 = local_68;
        local_48 = local_210;
        local_40 = lVar1;
        local_38 = local_68;
        local_30 = local_210;
        std::operator<<(aoStack_200,local_68);
        local_20 = local_60;
        local_28 = local_70;
        local_8 = local_60;
        local_10 = local_70;
        local_18 = lVar1;
        std::operator<<((ostream *)(local_60 + 0x10),local_70);
        logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
        logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x1772a8);
      }
      Result::Success();
    }
  }
  return (Result)in_RDI;
}

Assistant:

Result SessionOutgoing::OnAcknowledgements(
    const uint8_t* data,
    unsigned bytes,
    Counter64 ackNonce,
    uint64_t receiveUsec)
{
    if (bytes < kAckOverheadBytes) {
        return Result("SessionOutgoing::OnAcknowledgements", "Truncated Ack", ErrorType::Tonk, Tonk_InvalidData);
    }

    // If ack was received out of order:
    if (ackNonce < LastAck.NextAcceptableNonce)
    {
        Deps.Logger->Debug("Ignored re-ordered ack");
        return Result::Success();
    }
    LastAck.NextAcceptableNonce = ackNonce + 1;

    // Decompress nonce field back to full size
    const Counter24 partialNonce = siamese::ReadU24_LE(data);
    const Counter64 recovered = Counter64::ExpandFromTruncated(LastAck.PeerNextExpectedNonce, partialNonce);

    // If ack was sent out of order:
    if (recovered < LastAck.PeerNextExpectedNonce) {
        return Result("SessionOutgoing::OnAcknowledgements", "Ack was sent out of order", ErrorType::Tonk, Tonk_InvalidData);
    }

    // If there is Ack data attached:
    if (bytes > kAckOverheadBytes)
    {
        // Process acknowledgement with encoder
        const int ackResult = siamese_encoder_ack(
            FECEncoder,
            data + kAckOverheadBytes,
            bytes - kAckOverheadBytes,
            &LastAck.PeerNextExpectedSeqNum);

        if (Siamese_Success != ackResult) {
            return Result("SessionOutgoing::OnAcknowledgements", "siamese_encoder_ack failed", ErrorType::Siamese, ackResult);
        }
    }

    // Message is validated - update state
    LastAck.PeerNextExpectedNonce = recovered;
    LastAck.ReceiveUsec = receiveUsec;

    // Update bandwidth control with realtime feedback
    BandwidthShape shape;
    shape.Decompress(data + 3);
    Deps.SenderControl->OnReceiverFeedback(shape);

    // If the peer is now caught up:
    if (PeerCaughtUp())
    {
        TONK_VERBOSE_OUTGOING_LOG("Peer caught up - sending AckAck for seqno=", LastAck.PeerNextExpectedSeqNum);

        // Send an AckAck
        uint8_t ackack[4];
        siamese::WriteU24_LE_Min4Bytes(ackack, LastAck.PeerNextExpectedSeqNum);

        return QueueUnreliable(
            protocol::MessageType_AckAck,
            ackack,
            protocol::kAckAckBytes);
    }

    TONK_VERBOSE_OUTGOING_LOG("Got Ack PeerNextExpectedSeq=", LastAck.PeerNextExpectedSeqNum,
        " PeerNextExpectedNonce=", LastAck.PeerNextExpectedNonce.ToUnsigned(), " bytes=", bytes);

    return Result::Success();
}